

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_e7b893::GetIndexArg(string *arg,int *idx,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  PolicyID id;
  string msg;
  long value;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  bVar1 = cmStrToLong(arg,&value);
  if (!bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0121,false);
    if (PVar2 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_a8,(cmPolicies *)0x79,id);
      local_58.View_._M_len = local_a8._M_string_length;
      local_58.View_._M_str = local_a8._M_dataplus._M_p;
      local_88.View_._M_len = 0x15;
      local_88.View_._M_str = " Invalid list index \"";
      cmStrCat<std::__cxx11::string,char[3]>(&msg,&local_58,&local_88,arg,(char (*) [3])0x615044);
      std::__cxx11::string::~string((string *)&local_a8);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&msg);
    }
    else {
      if (PVar2 == NEW) {
        return false;
      }
      if (PVar2 != WARN) goto LAB_0030effa;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_a8,(cmPolicies *)0x79,id);
      local_58.View_._M_len = local_a8._M_string_length;
      local_58.View_._M_str = local_a8._M_dataplus._M_p;
      local_88.View_._M_len = 0x15;
      local_88.View_._M_str = " Invalid list index \"";
      cmStrCat<std::__cxx11::string,char[3]>(&msg,&local_58,&local_88,arg,(char (*) [3])0x615044);
      std::__cxx11::string::~string((string *)&local_a8);
      cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&msg);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
LAB_0030effa:
  *idx = (int)value;
  return true;
}

Assistant:

bool GetIndexArg(const std::string& arg, int* idx, cmMakefile& mf)
{
  long value;
  if (!cmStrToLong(arg, &value)) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0121)) {
      case cmPolicies::WARN: {
        // Default is to warn and use old behavior OLD behavior is to allow
        // compatibility, so issue a warning and use the previous behavior.
        std::string warn =
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::AUTHOR_WARNING, warn);
        CM_FALLTHROUGH;
      }
      case cmPolicies::OLD:
        // OLD behavior is to allow compatibility, so just ignore the
        // situation.
        break;
      case cmPolicies::NEW:
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        std::string msg =
          cmStrCat(cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::FATAL_ERROR, msg);
        break;
    }
  }

  // Truncation is happening here, but it had always been happening here.
  *idx = static_cast<int>(value);

  return true;
}